

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_node(lys_ypr_ctx_conflict *pctx,lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  uVar1 = node->nodetype;
  if (uVar1 == 1) {
    yprp_container(pctx,node);
  }
  else if (uVar1 == 2) {
    yprp_choice(pctx,node);
  }
  else if (uVar1 == 4) {
    yprp_leaf(pctx,node);
  }
  else if (uVar1 == 8) {
    yprp_leaflist(pctx,node);
  }
  else if (uVar1 == 0x10) {
    yprp_list(pctx,node);
  }
  else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
    yprp_anydata(pctx,node);
  }
  else if (uVar1 == 0x80) {
    yprp_case(pctx,node);
  }
  else if (uVar1 == 0x800) {
    yprp_uses(pctx,node);
  }
  return;
}

Assistant:

static void
yprp_node(struct lys_ypr_ctx *pctx, const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        yprp_container(pctx, node);
        break;
    case LYS_CHOICE:
        yprp_choice(pctx, node);
        break;
    case LYS_LEAF:
        yprp_leaf(pctx, node);
        break;
    case LYS_LEAFLIST:
        yprp_leaflist(pctx, node);
        break;
    case LYS_LIST:
        yprp_list(pctx, node);
        break;
    case LYS_USES:
        yprp_uses(pctx, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yprp_anydata(pctx, node);
        break;
    case LYS_CASE:
        yprp_case(pctx, node);
        break;
    default:
        break;
    }
}